

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  byte *pbVar1;
  uint8 uVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  Limit LVar7;
  string *psVar8;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  uint8 *puVar9;
  LogMessage *pLVar10;
  uint8 *puVar11;
  LogLevel LVar12;
  int iVar13;
  uint32 tag;
  int iVar14;
  int iVar15;
  uint32 temp;
  LogFinisher local_a9;
  RepeatedField<int> *local_a8;
  RepeatedField<int> *local_a0;
  LogMessage local_98;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_a0 = &this->weak_dependency_;
  local_a8 = &this->public_dependency_;
  local_40 = &(this->dependency_).super_RepeatedPtrFieldBase;
  local_48 = &(this->message_type_).super_RepeatedPtrFieldBase;
  local_50 = &(this->enum_type_).super_RepeatedPtrFieldBase;
  local_58 = &(this->service_).super_RepeatedPtrFieldBase;
  local_60 = &(this->extension_).super_RepeatedPtrFieldBase;
  local_38 = &this->_unknown_fields_;
LAB_001e39cb:
  do {
    puVar9 = input->buffer_;
    if ((puVar9 < input->buffer_end_) && (tag = (uint32)(char)*puVar9, -1 < (char)*puVar9)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar9 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar6 = tag & 7;
    switch(tag >> 3) {
    case 1:
      if (uVar6 == 2) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        psVar8 = this->name_;
        if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar8 = (string *)operator_new(0x20);
          (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
          psVar8->_M_string_length = 0;
          (psVar8->field_2)._M_local_buf[0] = '\0';
          this->name_ = psVar8;
        }
        bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
        if (!bVar5) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) && (*puVar9 == '\x12')) {
          input->buffer_ = puVar9 + 1;
LAB_001e3b15:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          psVar8 = this->package_;
          if (psVar8 == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar8 = (string *)operator_new(0x20);
            (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
            psVar8->_M_string_length = 0;
            (psVar8->field_2)._M_local_buf[0] = '\0';
            this->package_ = psVar8;
          }
          bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
          if (!bVar5) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,PARSE)
          ;
          puVar9 = input->buffer_;
          if ((puVar9 < input->buffer_end_) && (*puVar9 == '\x1a')) {
            do {
              input->buffer_ = puVar9 + 1;
LAB_001e3c12:
              iVar15 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
              iVar14 = (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
              if (iVar15 < iVar14) {
                ppvVar4 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
                (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                psVar8 = (string *)ppvVar4[iVar15];
              }
              else {
                if (iVar14 == (this->dependency_).super_RepeatedPtrFieldBase.total_size_) {
                  internal::RepeatedPtrFieldBase::Reserve(local_40,iVar14 + 1);
                  iVar14 = (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
                }
                (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_ = iVar14 + 1;
                psVar8 = internal::StringTypeHandlerBase::New_abi_cxx11_();
                ppvVar4 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
                iVar15 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
                (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                ppvVar4[iVar15] = psVar8;
              }
              bVar5 = internal::WireFormatLite::ReadString(input,psVar8);
              if (!bVar5) {
                return false;
              }
              puVar3 = (undefined8 *)
                       (this->dependency_).super_RepeatedPtrFieldBase.elements_
                       [(long)(this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1];
              internal::WireFormat::VerifyUTF8StringFallback
                        ((char *)*puVar3,*(int *)(puVar3 + 1),PARSE);
              puVar9 = input->buffer_;
              if (input->buffer_end_ <= puVar9) goto LAB_001e39cb;
            } while (*puVar9 == '\x1a');
            if (*puVar9 == '\"') {
              do {
                input->buffer_ = puVar9 + 1;
LAB_001e3cb7:
                iVar15 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
                iVar14 = (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
                if (iVar15 < iVar14) {
                  ppvVar4 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
                  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                  this_00 = (DescriptorProto *)ppvVar4[iVar15];
                }
                else {
                  if (iVar14 == (this->message_type_).super_RepeatedPtrFieldBase.total_size_) {
                    internal::RepeatedPtrFieldBase::Reserve(local_48,iVar14 + 1);
                    iVar14 = (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
                  }
                  (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar14 + 1;
                  this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
                  ppvVar4 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
                  iVar15 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
                  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                  ppvVar4[iVar15] = this_00;
                }
                puVar9 = input->buffer_;
                if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                  input->buffer_ = puVar9 + 1;
                  local_98.level_ = (int)(char)uVar2;
                }
                else {
                  bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_98.level_);
                  if (!bVar5) {
                    return false;
                  }
                }
                iVar15 = input->recursion_depth_;
                input->recursion_depth_ = iVar15 + 1;
                if (input->recursion_limit_ <= iVar15) {
                  return false;
                }
                LVar7 = io::CodedInputStream::PushLimit(input,local_98.level_);
                bVar5 = DescriptorProto::MergePartialFromCodedStream(this_00,input);
                if (!bVar5) {
                  return false;
                }
                if (input->legitimate_message_end_ != true) {
                  return false;
                }
                io::CodedInputStream::PopLimit(input,LVar7);
                if (0 < input->recursion_depth_) {
                  input->recursion_depth_ = input->recursion_depth_ + -1;
                }
                puVar9 = input->buffer_;
                if (input->buffer_end_ <= puVar9) goto LAB_001e39cb;
              } while (*puVar9 == '\"');
              if (*puVar9 == '*') {
                do {
                  input->buffer_ = puVar9 + 1;
LAB_001e3dbe:
                  iVar15 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                  iVar14 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                  if (iVar15 < iVar14) {
                    ppvVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                    this_01 = (EnumDescriptorProto *)ppvVar4[iVar15];
                  }
                  else {
                    if (iVar14 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
                      internal::RepeatedPtrFieldBase::Reserve(local_50,iVar14 + 1);
                      iVar14 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                    }
                    (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar14 + 1;
                    this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::
                              New();
                    ppvVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                    iVar15 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                    ppvVar4[iVar15] = this_01;
                  }
                  puVar9 = input->buffer_;
                  if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                    input->buffer_ = puVar9 + 1;
                    local_98.level_ = (int)(char)uVar2;
                  }
                  else {
                    bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_98.level_);
                    if (!bVar5) {
                      return false;
                    }
                  }
                  iVar15 = input->recursion_depth_;
                  input->recursion_depth_ = iVar15 + 1;
                  if (input->recursion_limit_ <= iVar15) {
                    return false;
                  }
                  LVar7 = io::CodedInputStream::PushLimit(input,local_98.level_);
                  bVar5 = EnumDescriptorProto::MergePartialFromCodedStream(this_01,input);
                  if (!bVar5) {
                    return false;
                  }
                  if (input->legitimate_message_end_ != true) {
                    return false;
                  }
                  io::CodedInputStream::PopLimit(input,LVar7);
                  if (0 < input->recursion_depth_) {
                    input->recursion_depth_ = input->recursion_depth_ + -1;
                  }
                  puVar9 = input->buffer_;
                  if (input->buffer_end_ <= puVar9) goto LAB_001e39cb;
                } while (*puVar9 == '*');
                if (*puVar9 == '2') {
                  do {
                    input->buffer_ = puVar9 + 1;
LAB_001e3ec8:
                    iVar15 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
                    iVar14 = (this->service_).super_RepeatedPtrFieldBase.allocated_size_;
                    if (iVar15 < iVar14) {
                      ppvVar4 = (this->service_).super_RepeatedPtrFieldBase.elements_;
                      (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                      this_02 = (ServiceDescriptorProto *)ppvVar4[iVar15];
                    }
                    else {
                      if (iVar14 == (this->service_).super_RepeatedPtrFieldBase.total_size_) {
                        internal::RepeatedPtrFieldBase::Reserve(local_58,iVar14 + 1);
                        iVar14 = (this->service_).super_RepeatedPtrFieldBase.allocated_size_;
                      }
                      (this->service_).super_RepeatedPtrFieldBase.allocated_size_ = iVar14 + 1;
                      this_02 = internal::
                                GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
                      ppvVar4 = (this->service_).super_RepeatedPtrFieldBase.elements_;
                      iVar15 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
                      (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                      ppvVar4[iVar15] = this_02;
                    }
                    puVar9 = input->buffer_;
                    if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                      input->buffer_ = puVar9 + 1;
                      local_98.level_ = (int)(char)uVar2;
                    }
                    else {
                      bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_98.level_);
                      if (!bVar5) {
                        return false;
                      }
                    }
                    iVar15 = input->recursion_depth_;
                    input->recursion_depth_ = iVar15 + 1;
                    if (input->recursion_limit_ <= iVar15) {
                      return false;
                    }
                    LVar7 = io::CodedInputStream::PushLimit(input,local_98.level_);
                    bVar5 = ServiceDescriptorProto::MergePartialFromCodedStream(this_02,input);
                    if (!bVar5) {
                      return false;
                    }
                    if (input->legitimate_message_end_ != true) {
                      return false;
                    }
                    io::CodedInputStream::PopLimit(input,LVar7);
                    if (0 < input->recursion_depth_) {
                      input->recursion_depth_ = input->recursion_depth_ + -1;
                    }
                    puVar9 = input->buffer_;
                    if (input->buffer_end_ <= puVar9) goto LAB_001e39cb;
                  } while (*puVar9 == '2');
                  if (*puVar9 == ':') {
                    do {
                      input->buffer_ = puVar9 + 1;
LAB_001e3fed:
                      iVar15 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                      iVar14 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                      if (iVar15 < iVar14) {
                        ppvVar4 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                        this_03 = (FieldDescriptorProto *)ppvVar4[iVar15];
                      }
                      else {
                        if (iVar14 == (this->extension_).super_RepeatedPtrFieldBase.total_size_) {
                          internal::RepeatedPtrFieldBase::Reserve(local_60,iVar14 + 1);
                          iVar14 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                        }
                        (this->extension_).super_RepeatedPtrFieldBase.allocated_size_ = iVar14 + 1;
                        this_03 = internal::
                                  GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
                        ppvVar4 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                        iVar15 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
                        ppvVar4[iVar15] = this_03;
                      }
                      puVar9 = input->buffer_;
                      if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                        input->buffer_ = puVar9 + 1;
                        local_98.level_ = (int)(char)uVar2;
                      }
                      else {
                        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_98.level_);
                        if (!bVar5) {
                          return false;
                        }
                      }
                      iVar15 = input->recursion_depth_;
                      input->recursion_depth_ = iVar15 + 1;
                      if (input->recursion_limit_ <= iVar15) {
                        return false;
                      }
                      LVar7 = io::CodedInputStream::PushLimit(input,local_98.level_);
                      bVar5 = FieldDescriptorProto::MergePartialFromCodedStream(this_03,input);
                      if (!bVar5) {
                        return false;
                      }
                      if (input->legitimate_message_end_ != true) {
                        return false;
                      }
                      io::CodedInputStream::PopLimit(input,LVar7);
                      if (0 < input->recursion_depth_) {
                        input->recursion_depth_ = input->recursion_depth_ + -1;
                      }
                      puVar9 = input->buffer_;
                      if (input->buffer_end_ <= puVar9) goto LAB_001e39cb;
                    } while (*puVar9 == ':');
                    if (*puVar9 == 'B') {
                      input->buffer_ = puVar9 + 1;
LAB_001e4112:
                      pbVar1 = (byte *)((long)this->_has_bits_ + 1);
                      *pbVar1 = *pbVar1 | 2;
                      this_04 = this->options_;
                      if (this_04 == (FileOptions *)0x0) {
                        this_04 = (FileOptions *)operator_new(0x88);
                        FileOptions::FileOptions(this_04);
                        this->options_ = this_04;
                      }
                      puVar9 = input->buffer_;
                      if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                        input->buffer_ = puVar9 + 1;
                        local_98.level_ = (int)(char)uVar2;
                      }
                      else {
                        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_98.level_);
                        if (!bVar5) {
                          return false;
                        }
                      }
                      iVar15 = input->recursion_depth_;
                      input->recursion_depth_ = iVar15 + 1;
                      if (input->recursion_limit_ <= iVar15) {
                        return false;
                      }
                      LVar7 = io::CodedInputStream::PushLimit(input,local_98.level_);
                      bVar5 = FileOptions::MergePartialFromCodedStream(this_04,input);
                      if (!bVar5) {
                        return false;
                      }
                      if (input->legitimate_message_end_ != true) {
                        return false;
                      }
                      io::CodedInputStream::PopLimit(input,LVar7);
                      if (0 < input->recursion_depth_) {
                        input->recursion_depth_ = input->recursion_depth_ + -1;
                      }
                      puVar9 = input->buffer_;
                      if ((puVar9 < input->buffer_end_) && (*puVar9 == 'J')) {
                        input->buffer_ = puVar9 + 1;
LAB_001e41ec:
                        pbVar1 = (byte *)((long)this->_has_bits_ + 1);
                        *pbVar1 = *pbVar1 | 4;
                        this_05 = this->source_code_info_;
                        if (this_05 == (SourceCodeInfo *)0x0) {
                          this_05 = (SourceCodeInfo *)operator_new(0x30);
                          SourceCodeInfo::SourceCodeInfo(this_05);
                          this->source_code_info_ = this_05;
                        }
                        puVar9 = input->buffer_;
                        if ((puVar9 < input->buffer_end_) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                          input->buffer_ = puVar9 + 1;
                          local_98.level_ = (int)(char)uVar2;
                        }
                        else {
                          bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_98.level_)
                          ;
                          if (!bVar5) {
                            return false;
                          }
                        }
                        iVar15 = input->recursion_depth_;
                        input->recursion_depth_ = iVar15 + 1;
                        if (input->recursion_limit_ <= iVar15) {
                          return false;
                        }
                        LVar7 = io::CodedInputStream::PushLimit(input,local_98.level_);
                        bVar5 = SourceCodeInfo::MergePartialFromCodedStream(this_05,input);
                        if (!bVar5) {
                          return false;
                        }
                        if (input->legitimate_message_end_ != true) {
                          return false;
                        }
                        io::CodedInputStream::PopLimit(input,LVar7);
                        if (0 < input->recursion_depth_) {
                          input->recursion_depth_ = input->recursion_depth_ + -1;
                        }
                        puVar9 = input->buffer_;
                        puVar11 = input->buffer_end_;
                        if ((puVar9 < puVar11) && (*puVar9 == 'P')) {
                          do {
                            puVar9 = puVar9 + 1;
                            input->buffer_ = puVar9;
LAB_001e42c9:
                            if ((puVar9 < puVar11) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                              input->buffer_ = puVar9 + 1;
                              LVar12 = (int)(char)uVar2;
                            }
                            else {
                              bVar5 = io::CodedInputStream::ReadVarint32Fallback
                                                (input,&local_98.level_);
                              LVar12 = local_98.level_;
                              if (!bVar5) {
                                return false;
                              }
                            }
                            iVar15 = (this->public_dependency_).current_size_;
                            if (iVar15 == (this->public_dependency_).total_size_) {
                              RepeatedField<int>::Reserve(local_a8,iVar15 + 1);
                              iVar15 = (this->public_dependency_).current_size_;
                            }
                            (this->public_dependency_).current_size_ = iVar15 + 1;
                            (this->public_dependency_).elements_[iVar15] = LVar12;
                            iVar15 = (this->public_dependency_).total_size_;
                            iVar14 = (this->public_dependency_).current_size_;
                            iVar13 = iVar15 - iVar14;
                            if (iVar13 != 0 && iVar14 <= iVar15) {
                              iVar13 = iVar13 + 1;
                              do {
                                puVar9 = input->buffer_;
                                if ((input->buffer_end_ <= puVar9) || (*puVar9 != 'P')) break;
                                puVar11 = puVar9 + 1;
                                input->buffer_ = puVar11;
                                if ((puVar11 < input->buffer_end_) &&
                                   (uVar2 = *puVar11, -1 < (char)uVar2)) {
                                  input->buffer_ = puVar9 + 2;
                                  LVar12 = (int)(char)uVar2;
                                }
                                else {
                                  bVar5 = io::CodedInputStream::ReadVarint32Fallback
                                                    (input,&local_98.level_);
                                  LVar12 = local_98.level_;
                                  if (!bVar5) {
                                    return false;
                                  }
                                }
                                iVar15 = (this->public_dependency_).current_size_;
                                if ((this->public_dependency_).total_size_ <= iVar15) {
                                  internal::LogMessage::LogMessage
                                            (&local_98,LOGLEVEL_DFATAL,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                                             ,0x259);
                                  pLVar10 = internal::LogMessage::operator<<
                                                      (&local_98,
                                                       "CHECK failed: (size()) < (Capacity()): ");
                                  internal::LogFinisher::operator=(&local_a9,pLVar10);
                                  internal::LogMessage::~LogMessage(&local_98);
                                  iVar15 = (this->public_dependency_).current_size_;
                                }
                                (this->public_dependency_).current_size_ = iVar15 + 1;
                                (this->public_dependency_).elements_[iVar15] = LVar12;
                                iVar13 = iVar13 + -1;
                              } while (1 < iVar13);
                            }
LAB_001e43e9:
                            puVar9 = input->buffer_;
                            puVar11 = input->buffer_end_;
                            if (puVar11 <= puVar9) goto LAB_001e39cb;
                          } while (*puVar9 == 'P');
                          if (*puVar9 == 'X') {
                            do {
                              puVar9 = puVar9 + 1;
                              input->buffer_ = puVar9;
LAB_001e4413:
                              if ((puVar9 < puVar11) && (uVar2 = *puVar9, -1 < (char)uVar2)) {
                                input->buffer_ = puVar9 + 1;
                                LVar12 = (int)(char)uVar2;
                              }
                              else {
                                bVar5 = io::CodedInputStream::ReadVarint32Fallback
                                                  (input,&local_98.level_);
                                LVar12 = local_98.level_;
                                if (!bVar5) {
                                  return false;
                                }
                              }
                              iVar15 = (this->weak_dependency_).current_size_;
                              if (iVar15 == (this->weak_dependency_).total_size_) {
                                RepeatedField<int>::Reserve(local_a0,iVar15 + 1);
                                iVar15 = (this->weak_dependency_).current_size_;
                              }
                              (this->weak_dependency_).current_size_ = iVar15 + 1;
                              (this->weak_dependency_).elements_[iVar15] = LVar12;
                              iVar15 = (this->weak_dependency_).total_size_;
                              iVar14 = (this->weak_dependency_).current_size_;
                              iVar13 = iVar15 - iVar14;
                              if (iVar13 != 0 && iVar14 <= iVar15) {
                                iVar13 = iVar13 + 1;
                                do {
                                  puVar9 = input->buffer_;
                                  if ((input->buffer_end_ <= puVar9) || (*puVar9 != 'X')) break;
                                  puVar11 = puVar9 + 1;
                                  input->buffer_ = puVar11;
                                  if ((puVar11 < input->buffer_end_) &&
                                     (uVar2 = *puVar11, -1 < (char)uVar2)) {
                                    input->buffer_ = puVar9 + 2;
                                    LVar12 = (int)(char)uVar2;
                                  }
                                  else {
                                    bVar5 = io::CodedInputStream::ReadVarint32Fallback
                                                      (input,&local_98.level_);
                                    LVar12 = local_98.level_;
                                    if (!bVar5) {
                                      return false;
                                    }
                                  }
                                  iVar15 = (this->weak_dependency_).current_size_;
                                  if ((this->weak_dependency_).total_size_ <= iVar15) {
                                    internal::LogMessage::LogMessage
                                              (&local_98,LOGLEVEL_DFATAL,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                                               ,0x259);
                                    pLVar10 = internal::LogMessage::operator<<
                                                        (&local_98,
                                                         "CHECK failed: (size()) < (Capacity()): ");
                                    internal::LogFinisher::operator=(&local_a9,pLVar10);
                                    internal::LogMessage::~LogMessage(&local_98);
                                    iVar15 = (this->weak_dependency_).current_size_;
                                  }
                                  (this->weak_dependency_).current_size_ = iVar15 + 1;
                                  (this->weak_dependency_).elements_[iVar15] = LVar12;
                                  iVar13 = iVar13 + -1;
                                } while (1 < iVar13);
                              }
LAB_001e4533:
                              puVar9 = input->buffer_;
                              puVar11 = input->buffer_end_;
                            } while ((puVar9 < puVar11) && (*puVar9 == 'X'));
                            if ((puVar9 == puVar11) &&
                               ((input->buffer_size_after_limit_ != 0 ||
                                (input->total_bytes_read_ == input->current_limit_)))) {
                              input->last_tag_ = 0;
                              input->legitimate_message_end_ = true;
                              return true;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001e39cb;
      }
      break;
    case 2:
      if (uVar6 == 2) goto LAB_001e3b15;
      break;
    case 3:
      if (uVar6 == 2) goto LAB_001e3c12;
      break;
    case 4:
      if (uVar6 == 2) goto LAB_001e3cb7;
      break;
    case 5:
      if (uVar6 == 2) goto LAB_001e3dbe;
      break;
    case 6:
      if (uVar6 == 2) goto LAB_001e3ec8;
      break;
    case 7:
      if (uVar6 == 2) goto LAB_001e3fed;
      break;
    case 8:
      if (uVar6 == 2) goto LAB_001e4112;
      break;
    case 9:
      if (uVar6 == 2) goto LAB_001e41ec;
      break;
    case 10:
      if (uVar6 == 0) {
        puVar9 = input->buffer_;
        puVar11 = input->buffer_end_;
        goto LAB_001e42c9;
      }
      if (uVar6 == 2) {
        bVar5 = internal::WireFormatLite::
                ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,local_a8);
        if (bVar5) goto LAB_001e43e9;
        return false;
      }
      break;
    case 0xb:
      if (uVar6 == 0) {
        puVar9 = input->buffer_;
        puVar11 = input->buffer_end_;
        goto LAB_001e4413;
      }
      if (uVar6 == 2) {
        bVar5 = internal::WireFormatLite::
                ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,local_a0);
        if (bVar5) goto LAB_001e4533;
        return false;
      }
    }
    if (uVar6 == 4) {
      return true;
    }
    bVar5 = internal::WireFormat::SkipField(input,tag,local_38);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_package;
        break;
      }

      // optional string package = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_dependency:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_dependency;
        if (input->ExpectTag(34)) goto parse_message_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_message_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_message_type;
        if (input->ExpectTag(42)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_enum_type;
        if (input->ExpectTag(50)) goto parse_service;
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_service:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_service;
        if (input->ExpectTag(58)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_extension;
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_source_code_info;
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_source_code_info:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_public_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80, input, this->mutable_public_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_public_dependency;
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak_dependency:
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88, input, this->mutable_weak_dependency())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(88)) goto parse_weak_dependency;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}